

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_function_queue.h
# Opt level: O0

optional<int> __thiscall
density::
lf_function_queue<int_(Struct_*),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::try_consume_impl(lf_function_queue<int_(Struct_*),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                   *this,lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                         *param_2,uintptr_t param_3)

{
  bool bVar1;
  FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)> *this_00;
  void *i_dest;
  int local_4c;
  int *local_48;
  int *result;
  consume_operation cons;
  Struct *i_params_local;
  lf_function_queue<int_(Struct_*),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  *this_local;
  
  cons.m_consume_data.m_next_ptr = param_3;
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::try_start_consume((consume_operation *)&result,param_2);
  bVar1 = density::lf_heter_queue::consume_operation::operator_cast_to_bool
                    ((consume_operation *)&result);
  if (bVar1) {
    this_00 = lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
              ::consume_operation::complete_type((consume_operation *)&result);
    i_dest = lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
             ::consume_operation::unaligned_element_ptr((consume_operation *)&result);
    local_4c = detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>::
               align_invoke_destroy(this_00,i_dest,(Struct *)cons.m_consume_data.m_next_ptr);
    local_48 = &local_4c;
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
    ::consume_operation::commit_nodestroy((consume_operation *)&result);
    builtin_optional<int>::builtin_optional<int>((builtin_optional<int> *)this,local_48);
  }
  else {
    memset(this,0,8);
    builtin_optional<int>::builtin_optional((builtin_optional<int> *)this);
  }
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::consume_operation::~consume_operation((consume_operation *)&result);
  return (optional<int>)this;
}

Assistant:

optional<RET_VAL> try_consume_impl(std::false_type, PARAMS... i_params)
        {
            if (auto cons = m_queue.try_start_consume())
            {
                auto && result = cons.complete_type().align_invoke_destroy(
                  cons.unaligned_element_ptr(), std::forward<PARAMS>(i_params)...);
                cons.commit_nodestroy();
                return optional<RET_VAL>(std::move(result));
            }
            else
            {
                return optional<RET_VAL>();
            }
        }